

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

void __thiscall
GF2::BFunc<6ul>::To<GF2::MOLex<6ul>>(BFunc<6UL> *this,MP<6UL,_GF2::MOLex<6UL>_> *polyRight)

{
  bool bVar1;
  uint uVar2;
  word x_00;
  Func<6UL,_bool> *in_RDI;
  MM<6UL> x;
  bool bCoeff;
  MM<6UL> mon;
  undefined4 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  byte saveWeight;
  WW<6UL> *in_stack_ffffffffffffffe8;
  
  MP<6UL,_GF2::MOLex<6UL>_>::operator=
            ((MP<6UL,_GF2::MOLex<6UL>_> *)
             CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             (bool)in_stack_ffffffffffffffdf);
  MM<6UL>::MM((MM<6UL> *)0x18845e);
  do {
    saveWeight = 0;
    MM<6UL>::MM((MM<6UL> *)0x18846d);
    do {
      bVar1 = MM<6UL>::Calc((MM<6UL> *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8)
                            ,(WW<6UL> *)in_RDI);
      uVar2 = (uint)bVar1;
      x_00 = GF2::WW::operator_cast_to_unsigned_long((WW *)&stack0xffffffffffffffd8);
      bVar1 = Func<6UL,_bool>::Get(in_RDI,x_00);
      saveWeight = (uint)(saveWeight & 1) != (uVar2 & bVar1);
      bVar1 = WW<6UL>::Next(in_stack_ffffffffffffffe8,(bool)saveWeight);
    } while (bVar1);
    if ((saveWeight & 1) != 0) {
      MP<6UL,_GF2::MOLex<6UL>_>::operator+=
                ((MP<6UL,_GF2::MOLex<6UL>_> *)in_RDI,
                 (MM<6UL> *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
    }
    bVar1 = WW<6UL>::Next(in_stack_ffffffffffffffe8,(bool)saveWeight);
  } while (bVar1);
  return;
}

Assistant:

void To(MP<_n, _O>& polyRight) const
	{	
		polyRight = 0;
		// цикл по мономам
		MM<_n> mon;
		do
		{
			bool bCoeff = 0;
			MM<_n> x;
			do bCoeff ^= x.Calc(mon) & Get(x);
			while (x.Next());
			if (bCoeff)
				polyRight += mon;
		}
		while(mon.Next());
	}